

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::EncodedDescriptorDatabase::~EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  bool bVar1;
  reference ppvVar2;
  void *p;
  iterator __end2;
  iterator __begin2;
  vector<void_*,_std::allocator<void_*>_> *__range2;
  EncodedDescriptorDatabase *this_local;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__EncodedDescriptorDatabase_008ebe28;
  __end2 = std::vector<void_*,_std::allocator<void_*>_>::begin(&this->files_to_delete_);
  p = (void *)std::vector<void_*,_std::allocator<void_*>_>::end(&this->files_to_delete_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                                *)&p);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&__end2);
    operator_delete(*ppvVar2);
    __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::operator++
              (&__end2);
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->files_to_delete_);
  std::
  unique_ptr<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
  ::~unique_ptr(&this->index_);
  DescriptorDatabase::~DescriptorDatabase(&this->super_DescriptorDatabase);
  return;
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (void* p : files_to_delete_) {
    operator delete(p);
  }
}